

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  int iVar1;
  float value_00;
  float local_48;
  float local_44;
  float local_3c;
  float value;
  float max_value;
  float min_value;
  int i;
  int offset_local;
  int count_local;
  _func_float_void_ptr_int *value_getter_local;
  void *userdata_local;
  nk_chart_type type_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5e1d,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (value_getter == (_func_float_void_ptr_int *)0x0) {
    __assert_fail("value_getter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5e1e,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (((ctx != (nk_context *)0x0) && (value_getter != (_func_float_void_ptr_int *)0x0)) &&
     (count != 0)) {
    local_3c = (*value_getter)(userdata,offset);
    value = local_3c;
    for (max_value = 0.0; (int)max_value < count; max_value = (float)((int)max_value + 1)) {
      local_48 = (*value_getter)(userdata,(int)max_value + offset);
      local_44 = local_48;
      if (value <= local_48) {
        local_44 = value;
      }
      value = local_44;
      if (local_48 < local_3c) {
        local_48 = local_3c;
      }
      local_3c = local_48;
    }
    iVar1 = nk_chart_begin(ctx,type,count,value,local_3c);
    if (iVar1 != 0) {
      for (max_value = 0.0; (int)max_value < count; max_value = (float)((int)max_value + 1)) {
        value_00 = (*value_getter)(userdata,(int)max_value + offset);
        nk_chart_push(ctx,value_00);
      }
      nk_chart_end(ctx);
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
    float(*value_getter)(void* user, int index), int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(value_getter);
    if (!ctx || !value_getter || !count) return;

    max_value = min_value = value_getter(userdata, offset);
    for (i = 0; i < count; ++i) {
        float value = value_getter(userdata, i + offset);
        min_value = NK_MIN(value, min_value);
        max_value = NK_MAX(value, max_value);
    }

    if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
        for (i = 0; i < count; ++i)
            nk_chart_push(ctx, value_getter(userdata, i + offset));
        nk_chart_end(ctx);
    }
}